

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::split_copy(PolyConnectivity *this,FaceHandle fh,VertexHandle vh)

{
  bool bVar1;
  value_type _fh_to;
  undefined1 local_38 [8];
  VertexFaceIter vf_it;
  PolyConnectivity *this_local;
  VertexHandle vh_local;
  FaceHandle fh_local;
  
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
       (int)vh.super_BaseHandle.idx_;
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = fh.super_BaseHandle.idx_;
  split(this,fh,vh);
  vf_iter((VertexFaceIter *)local_38,this,vh);
  while( true ) {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)local_38);
    if (!bVar1) break;
    _fh_to = Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                          *)local_38);
    BaseKernel::copy_all_properties
              ((BaseKernel *)this,(FaceHandle)fh.super_BaseHandle.idx_,
               (FaceHandle)_fh_to.super_BaseHandle.idx_,false);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_38);
  }
  return;
}

Assistant:

void PolyConnectivity::split_copy(FaceHandle fh, VertexHandle vh) {

  // Split the given face (fh will still be valid)
  split(fh, vh);

  // Copy the property of the original face to all new faces
  for(VertexFaceIter vf_it =  vf_iter(vh); vf_it.is_valid(); ++vf_it)
    copy_all_properties(fh, *vf_it);
}